

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbeat_message_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::HeartbeatMessageTest_test_to_string_Test::TestBody
          (HeartbeatMessageTest_test_to_string_Test *this)

{
  bool bVar1;
  char *message_00;
  AssertionResult gtest_ar;
  HeartbeatMessage message;
  AssertHelper local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  HeartbeatMessage local_18 [8];
  
  bidfx_public_api::price::pixie::HeartbeatMessage::HeartbeatMessage(local_18);
  bidfx_public_api::price::pixie::HeartbeatMessage::ToString_abi_cxx11_();
  testing::internal::CmpHelperEQ<char[12],std::__cxx11::string>
            (local_28,"\"Heartbeat()\"","message.ToString()",(char (*) [12])"Heartbeat()",&local_48)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/heartbeat_message_test.cpp"
               ,0x2b,message_00);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_48._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
      }
      local_48._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(HeartbeatMessageTest, test_to_string)
{
    HeartbeatMessage message;
    EXPECT_EQ("Heartbeat()", message.ToString());
}